

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixCursor.h
# Opt level: O2

array<unsigned_short,_5UL> __thiscall
ZXing::BitMatrixCursor<ZXing::PointT<int>>::readPattern<std::array<unsigned_short,5ul>>
          (BitMatrixCursor<ZXing::PointT<int>> *this,int range)

{
  uint uVar1;
  long lVar2;
  array<unsigned_short,_5UL> aVar3;
  array<unsigned_short,_5UL> res;
  
  res._M_elems[4] = 0;
  res._M_elems[0] = 0;
  res._M_elems[1] = 0;
  res._M_elems[2] = 0;
  res._M_elems[3] = 0;
  for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 2) {
    uVar1 = BitMatrixCursor<ZXing::PointT<int>_>::stepToEdge
                      ((BitMatrixCursor<ZXing::PointT<int>_> *)this,1,range,false);
    *(short *)((long)res._M_elems + lVar2) = (short)uVar1;
    if ((short)uVar1 == 0) break;
    if (range != 0) {
      range = range - (uVar1 & 0xffff);
    }
  }
  aVar3._M_elems[0] = res._M_elems[0];
  aVar3._M_elems[1] = res._M_elems[1];
  aVar3._M_elems[2] = res._M_elems[2];
  aVar3._M_elems[3] = res._M_elems[3];
  aVar3._M_elems[4] = res._M_elems[4];
  return (array<unsigned_short,_5UL>)aVar3._M_elems;
}

Assistant:

ARRAY readPattern(int range = 0)
	{
		ARRAY res = {};
		for (auto& i : res) {
			i = stepToEdge(1, range);
			if (!i)
				return res;
			if (range)
				range -= i;
		}
		return res;
	}